

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplication::~QApplication(QApplication *this)

{
  Span *pSVar1;
  QWidget *this_00;
  QWidgetMapper *pQVar2;
  QWidgetSet *this_01;
  Type *this_02;
  EVP_PKEY_CTX *pEVar3;
  ulong uVar4;
  QFont *pQVar5;
  EVP_PKEY_CTX *ctx;
  QWidgetSet *mySet;
  long in_FS_OFFSET;
  piter pVar6;
  iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> local_48;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007bf520;
  qt_call_post_routines();
  QBasicTimer::stop();
  QBasicTimer::stop();
  pQVar2 = QWidgetPrivate::mapper;
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  if (QWidgetPrivate::mapper != (QWidgetMapper *)0x0) {
    QHash<unsigned_long_long,_QWidget_*>::~QHash(QWidgetPrivate::mapper);
  }
  operator_delete(pQVar2,8);
  this_01 = QWidgetPrivate::allWidgets;
  QWidgetPrivate::mapper = (QWidgetMapper *)0x0;
  if (QWidgetPrivate::allWidgets != (QWidgetSet *)0x0) {
    QWidgetPrivate::allWidgets = (QWidgetSet *)0x0;
    pVar6 = (piter)QHash<QWidget_*,_QHashDummyValue>::constBegin(&this_01->q_hash);
    local_48.d._0_4_ = pVar6.d._0_4_;
    local_48._4_8_ = pVar6._4_8_;
    local_48.bucket._4_4_ = pVar6.bucket._4_4_;
    while( true ) {
      if (pVar6.d == (Data<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_> *)0x0 &&
          pVar6.bucket == 0) break;
      pSVar1 = (pVar6.d)->spans;
      uVar4 = pVar6.bucket >> 7;
      this_00 = *(QWidget **)
                 pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)pVar6.bucket & 0x7f]].storage.
                 data;
      if (*(long *)(*(long *)&this_00->field_0x8 + 0x10) == 0) {
        QWidget::destroy(this_00,true,true);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QHashDummyValue>_>::operator++(&local_48)
      ;
      pVar6._4_8_ = local_48._4_8_;
      pVar6.d._0_4_ = local_48.d._0_4_;
      pVar6.bucket._4_4_ = local_48.bucket._4_4_;
    }
    QHash<QWidget_*,_QHashDummyValue>::~QHash(&this_01->q_hash);
    operator_delete(this_01,8);
  }
  if (qt_desktopWidget != (QWidget *)0x0) {
    (**(code **)(*(long *)qt_desktopWidget + 0x20))();
  }
  qt_desktopWidget = (QWidget *)0x0;
  QHash<QByteArray,_QPalette>::clear(&QApplicationPrivate::widgetPalettes);
  pQVar5 = QApplicationPrivate::sys_font;
  if (QApplicationPrivate::sys_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::sys_font);
  }
  operator_delete(pQVar5,0x10);
  pQVar5 = QApplicationPrivate::set_font;
  QApplicationPrivate::sys_font = (QFont *)0x0;
  if (QApplicationPrivate::set_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::set_font);
  }
  operator_delete(pQVar5,0x10);
  QApplicationPrivate::set_font = (QFont *)0x0;
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>::guard._q_value.
      super___atomic_base<signed_char>._M_i == -1) {
    this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::
              operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                          *)pQVar5);
    QHash<QByteArray,_QFont>::clear(this_02);
  }
  ctx = (EVP_PKEY_CTX *)QApplicationPrivate::app_style;
  if (QApplicationPrivate::app_style != (QStyle *)0x0) {
    (**(code **)(*(long *)QApplicationPrivate::app_style + 0x20))();
    ctx = (EVP_PKEY_CTX *)QApplicationPrivate::app_style;
  }
  QApplicationPrivate::app_style = (QStyle *)0x0;
  if (qt_is_tty_app == '\0') {
    pEVar3 = (EVP_PKEY_CTX *)QDragManager::self();
    if (pEVar3 != (EVP_PKEY_CTX *)0x0) {
      (**(code **)(*(long *)pEVar3 + 0x20))();
      ctx = pEVar3;
    }
  }
  QPixmapCache::clear();
  QColormap::cleanup(ctx);
  QApplicationPrivate::active_window = (QWidget *)0x0;
  if (QApplicationPrivate::widgetCount == true) {
    local_48.d._0_4_ = 2;
    local_34 = 0;
    local_48._4_8_ = 0;
    local_48.bucket._4_4_ = 0;
    uStack_38 = 0;
    local_30 = "default";
    QMessageLogger::debug
              ((char *)&local_48,"Widgets left: %i    Max widgets: %i \n",
               (ulong)(uint)QWidgetPrivate::instanceCounter,
               (ulong)(uint)QWidgetPrivate::maxInstances);
  }
  QGuiApplicationPrivate::obey_desktop_settings._0_1_ = 1;
  QApplicationPrivate::enabledAnimations = 1;
  QApplicationPrivate::widgetCount = false;
  QGuiApplication::~QGuiApplication(&this->super_QGuiApplication);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QApplication::~QApplication()
{
    Q_D(QApplication);

    //### this should probable be done even later
    qt_call_post_routines();

    // kill timers before closing down the dispatcher
    d->toolTipWakeUp.stop();
    d->toolTipFallAsleep.stop();

    QApplicationPrivate::is_app_closing = true;
    QApplicationPrivate::is_app_running = false;

    delete QWidgetPrivate::mapper;
    QWidgetPrivate::mapper = nullptr;

    // delete all widgets
    if (QWidgetPrivate::allWidgets) {
        QWidgetSet *mySet = QWidgetPrivate::allWidgets;
        QWidgetPrivate::allWidgets = nullptr;
        for (QWidgetSet::ConstIterator it = mySet->constBegin(), cend = mySet->constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->parent())                        // window
                w->destroy(true, true);
        }
        delete mySet;
    }

    delete qt_desktopWidget;
    qt_desktopWidget = nullptr;

    QApplicationPrivate::widgetPalettes.clear();

    delete QApplicationPrivate::sys_font;
    QApplicationPrivate::sys_font = nullptr;
    delete QApplicationPrivate::set_font;
    QApplicationPrivate::set_font = nullptr;
    if (app_fonts.exists())
        app_fonts()->clear();

    delete QApplicationPrivate::app_style;
    QApplicationPrivate::app_style = nullptr;

#if QT_CONFIG(draganddrop)
    if (!qt_is_tty_app)
        delete QDragManager::self();
#endif

    d->cleanupMultitouch();

    QPixmapCache::clear();
    QColormap::cleanup();

    QApplicationPrivate::active_window = nullptr; //### this should not be necessary

    if (QApplicationPrivate::widgetCount)
        qDebug("Widgets left: %i    Max widgets: %i \n", QWidgetPrivate::instanceCounter, QWidgetPrivate::maxInstances);

    QApplicationPrivate::obey_desktop_settings = true;

    QApplicationPrivate::enabledAnimations = QPlatformTheme::GeneralUiEffect;
    QApplicationPrivate::widgetCount = false;
}